

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],char_const&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1)

{
  char (*value) [2];
  char *value_00;
  char local_31 [1];
  ArrayPtr<const_char> local_30;
  char (*local_20) [2];
  char *params_local_1;
  char (*params_local) [2];
  
  local_20 = params;
  params_local_1 = (char *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_30 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<char_const&>(*local_20);
  local_31[0] = (char)toCharSequence<char_const&>(value_00);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)local_31,
             (FixedArray<char,_1UL> *)params_1);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}